

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMaj.c
# Opt level: O0

int Gem_Enumerate(int nVars,int fDump,int fVerbose)

{
  int iVar1;
  int iVar2;
  abctime aVar3;
  Gem_Man_t *p_00;
  abctime aVar4;
  int local_3c;
  int nObjsStopPrev;
  int nObjsStop;
  int j;
  int i;
  int f;
  int v;
  Gem_Man_t *p;
  abctime clk;
  int fVerbose_local;
  int fDump_local;
  int nVars_local;
  
  aVar3 = Abc_Clock();
  p_00 = Gem_ManAlloc(nVars,fVerbose);
  local_3c = 1;
  i = 1;
  do {
    if (nVars + -2 < i) {
      printf("Finished          (functions = %10d)  ",(ulong)(uint)p_00->nObjs);
      aVar4 = Abc_Clock();
      Abc_PrintTime(0,"Time",aVar4 - aVar3);
      if (fDump != 0) {
        Vec_MemDumpTruthTables(p_00->vTtMem,"enum",nVars);
      }
      Gem_ManFree(p_00);
      return 0;
    }
    iVar2 = p_00->nObjs;
    printf("Expanding  var %2d (functions = %10d)  ",(ulong)(uint)i,(ulong)(uint)p_00->nObjs);
    aVar4 = Abc_Clock();
    Abc_PrintTime(0,"Time",aVar4 - aVar3);
    for (j = 0; j < iVar2; j = j + 1) {
      if ((i == (*(uint *)(p_00->pObjs + j) & 0xf)) ||
         (((int)(*(uint *)(p_00->pObjs + j) & 0xf) < i && (local_3c <= j)))) {
        for (nObjsStop = 0; nObjsStop < i; nObjsStop = nObjsStop + 1) {
          if ((*(uint *)(p_00->pObjs + j) >> 0x10 & 1 << ((byte)nObjsStop & 0x1f)) != 0) {
            Gem_FuncExpand(p_00,j,nObjsStop);
          }
        }
      }
    }
    printf("Connecting var %2d (functions = %10d)  ",(ulong)(uint)i,(ulong)(uint)p_00->nObjs);
    aVar4 = Abc_Clock();
    Abc_PrintTime(0,"Time",aVar4 - aVar3);
    for (j = iVar2; j < p_00->nObjs; j = j + 1) {
      for (nObjsStop = 0; nObjsStop < (int)(*(uint *)(p_00->pObjs + j) & 0xf);
          nObjsStop = nObjsStop + 1) {
        nObjsStopPrev = nObjsStop;
        if ((*(uint *)(p_00->pObjs + j) >> 0x10 & 1 << ((byte)nObjsStop & 0x1f)) != 0) {
          while (nObjsStopPrev = nObjsStopPrev + 1,
                nObjsStopPrev < (int)(*(uint *)(p_00->pObjs + j) & 0xf)) {
            if (((*(uint *)(p_00->pObjs + j) >> 0x10 & 1 << ((byte)nObjsStopPrev & 0x1f)) != 0) &&
               (iVar1 = Gem_FuncReduce(p_00,j,nObjsStop,nObjsStopPrev), iVar1 != 0)) {
              iVar2 = Gem_ManFree(p_00);
              return iVar2;
            }
          }
        }
      }
    }
    i = i + 1;
    local_3c = iVar2;
  } while( true );
}

Assistant:

int Gem_Enumerate( int nVars, int fDump, int fVerbose )
{
    abctime clk = Abc_Clock();
    Gem_Man_t * p = Gem_ManAlloc( nVars, fVerbose );
    int v, f, i, j, nObjsStop = 1;
    for ( v = 1; v <= nVars-2; v++ )
    {
        // expand functions by adding a gate
        int nObjsStopPrev = nObjsStop;
        nObjsStop = p->nObjs;
        printf( "Expanding  var %2d (functions = %10d)  ", v, p->nObjs );
        Abc_PrintTime( 0, "Time", Abc_Clock() - clk );
        for ( f = 0; f < nObjsStop; f++ )
            if ( v == (int)p->pObjs[f].nVars || (v > (int)p->pObjs[f].nVars && f >= nObjsStopPrev) )
                for ( i = 0; i < v; i++ )
                    if ( (int)p->pObjs[f].Groups & (1 << i) )
                        Gem_FuncExpand( p, f, i );
        // reduce functions by adding a crossbar
        printf( "Connecting var %2d (functions = %10d)  ", v, p->nObjs );
        Abc_PrintTime( 0, "Time", Abc_Clock() - clk );
        for ( f = nObjsStop; f < p->nObjs; f++ )
            for ( i = 0; i < (int)p->pObjs[f].nVars; i++ )
                if ( (int)p->pObjs[f].Groups & (1 << i) )
                    for ( j = i+1; j < (int)p->pObjs[f].nVars; j++ )
                        if ( (int)p->pObjs[f].Groups & (1 << j) )
                            if ( Gem_FuncReduce( p, f, i, j ) )
                                return Gem_ManFree( p );
    }
    printf( "Finished          (functions = %10d)  ", p->nObjs );
    Abc_PrintTime( 0, "Time", Abc_Clock() - clk );
    if ( fDump ) Vec_MemDumpTruthTables( p->vTtMem, "enum", nVars );
    Gem_ManFree( p );
    return 0;
}